

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Connection::ReadCSV
          (Connection *this,string *csv_file,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *columns)

{
  string *psVar1;
  ParserOptions options_00;
  pointer pCVar2;
  ClientContext *this_00;
  ColumnDefinition *this_01;
  ParserException *this_02;
  undefined8 *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *column_list_00;
  shared_ptr<duckdb::Relation,_true> sVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  child_list_t<Value> column_list;
  string local_1b0;
  ParserOptions local_190;
  ColumnList col_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  files;
  LogicalType local_a0;
  named_parameter_map_t options;
  string local_50;
  
  options._M_h._M_buckets = &options._M_h._M_single_bucket;
  options._M_h._M_bucket_count = 1;
  options._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  options._M_h._M_element_count = 0;
  options._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  options._M_h._M_rehash_policy._M_next_resize = 0;
  options._M_h._M_single_bucket = (__node_base_ptr)0x0;
  column_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  column_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  column_list.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  column_list_00 = (string *)*in_RCX;
  psVar1 = (string *)in_RCX[1];
  while( true ) {
    if (column_list_00 == psVar1) {
      ::std::__cxx11::string::string((string *)&col_list,(string *)columns);
      __l._M_len = 1;
      __l._M_array = (iterator)&col_list;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&files,__l,(allocator_type *)&local_1b0);
      ::std::__cxx11::string::~string((string *)&col_list);
      make_shared_ptr<duckdb::ReadCSVRelation,duckdb::shared_ptr<duckdb::ClientContext,true>&,duckdb::vector<std::__cxx11::string,true>&,std::unordered_map<std::__cxx11::string,duckdb::Value,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>>
                ((shared_ptr<duckdb::ClientContext,_true> *)&col_list,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)csv_file,
                 (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                  *)&files);
      pCVar2 = col_list.columns.
               super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
               super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      col_list.columns.
      super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
      super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)
                col_list.columns.
                super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
                super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCVar2;
      col_list.columns.
      super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
      super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &col_list.columns.
                  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
                  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&files);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ::~vector(&column_list.
                 super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
               );
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&options._M_h);
      sVar3.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = extraout_RDX._M_pi;
      sVar3.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<duckdb::Relation,_true>)
             sVar3.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
    }
    this_00 = shared_ptr<duckdb::ClientContext,_true>::operator->
                        ((shared_ptr<duckdb::ClientContext,_true> *)csv_file);
    ClientContext::GetParserOptions(&local_190,this_00);
    options_00.max_expression_depth = local_190.max_expression_depth;
    options_00.preserve_identifier_case = local_190.preserve_identifier_case;
    options_00.integer_division = local_190.integer_division;
    options_00._2_6_ = local_190._2_6_;
    options_00.extensions = local_190.extensions;
    Parser::ParseColumnList(&col_list,column_list_00,options_00);
    if ((long)col_list.columns.
              super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
              super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)col_list.columns.
              super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
              super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
              ._M_impl.super__Vector_impl_data._M_start != 0xd8) break;
    this_01 = ColumnList::GetColumnMutable(&col_list,(LogicalIndex)0x0);
    ColumnDefinition::GetName_abi_cxx11_(&local_1b0,this_01);
    ColumnDefinition::GetType(&local_a0,this_01);
    LogicalType::ToString_abi_cxx11_(&local_50,&local_a0);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
                *)&files,&local_1b0,&local_50);
    ::std::
    vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
    ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
              ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
                *)&column_list,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
                *)&files);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
             *)&files);
    ::std::__cxx11::string::~string((string *)&local_50);
    LogicalType::~LogicalType(&local_a0);
    ::std::__cxx11::string::~string((string *)&local_1b0);
    ColumnList::~ColumnList(&col_list);
    column_list_00 = column_list_00 + 1;
  }
  this_02 = (ParserException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&files,"Expected a single column definition",(allocator *)&local_1b0);
  ParserException::ParserException(this_02,(string *)&files);
  __cxa_throw(this_02,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

shared_ptr<Relation> Connection::ReadCSV(const string &csv_file, const vector<string> &columns) {
	// parse columns
	named_parameter_map_t options;
	child_list_t<Value> column_list;
	for (auto &column : columns) {
		auto col_list = Parser::ParseColumnList(column, context->GetParserOptions());
		if (col_list.LogicalColumnCount() != 1) {
			throw ParserException("Expected a single column definition");
		}
		auto &col_def = col_list.GetColumnMutable(LogicalIndex(0));
		column_list.push_back({col_def.GetName(), col_def.GetType().ToString()});
	}
	vector<string> files {csv_file};
	return make_shared_ptr<ReadCSVRelation>(context, files, std::move(options));
}